

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O2

char * skip_ws(char *p,char *end)

{
  for (; (p < end && ((*p == ' ' || (*p == '\t')))); p = p + 1) {
  }
  return p;
}

Assistant:

static inline const char* skip_ws(const char* p, const char* end)
{
	while (p < end) {
		int c = *p;
		if (c != ' ' && c != '\t')
			break;
		++p;
	}
	return p;
}